

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

basic_string<char,_eastl::allocator> * __thiscall
eastl::basic_string<char,_eastl::allocator>::append
          (basic_string<char,_eastl::allocator> *this,value_type *pBegin,value_type *pEnd)

{
  value_type *__src;
  value_type *pvVar1;
  uint uVar2;
  value_type *__dest;
  uint uVar3;
  uint uVar4;
  ulong __n;
  size_t __n_00;
  value_type *__dest_00;
  
  if (pBegin != pEnd) {
    __src = this->mpBegin;
    __n_00 = (long)this->mpEnd - (long)__src;
    __n = (long)pEnd - (long)pBegin;
    pvVar1 = this->mpCapacity;
    uVar2 = ~(uint)__src + (int)pvVar1;
    uVar3 = (int)__n + (int)__n_00;
    if (uVar2 < uVar3) {
      uVar4 = 8;
      if (8 < uVar2) {
        uVar4 = uVar2 * 2;
      }
      if (uVar4 <= uVar3) {
        uVar4 = uVar3;
      }
      __dest = (value_type *)malloc((ulong)(uVar4 + 1));
      memmove(__dest,__src,__n_00);
      __dest_00 = __dest + __n_00;
      memcpy(__dest_00,pBegin,__n);
      __dest_00[__n] = '\0';
      if (__src != (value_type *)0x0 && 1 < (long)pvVar1 - (long)__src) {
        operator_delete__(__src);
      }
      this->mpBegin = __dest;
      this->mpEnd = __dest_00 + __n;
      this->mpCapacity = __dest + (uVar4 + 1);
    }
    else {
      memmove(this->mpEnd + 1,pBegin + 1,(long)pEnd - (long)(pBegin + 1));
      this->mpEnd[__n & 0xffffffff] = '\0';
      *this->mpEnd = *pBegin;
      this->mpEnd = this->mpEnd + (__n & 0xffffffff);
    }
  }
  return this;
}

Assistant:

basic_string<T, Allocator>& basic_string<T, Allocator>::append(const value_type* pBegin, const value_type* pEnd)
    {
        if(pBegin != pEnd)
        {
            const size_type nOldSize = (size_type)(mpEnd - mpBegin);
            const size_type n        = (size_type)(pEnd - pBegin);

            #if EASTL_STRING_OPT_LENGTH_ERRORS
                if(EASTL_UNLIKELY(((size_t)n > kMaxSize) || (nOldSize > (kMaxSize - n))))
                    ThrowLengthException();
            #endif

            const size_type nCapacity = (size_type)((mpCapacity - mpBegin) - 1);

            if((nOldSize + n) > nCapacity)
            {
                const size_type nLength = eastl::max_alt((size_type)GetNewCapacity(nCapacity), (size_type)(nOldSize + n)) + 1; // + 1 to accomodate the trailing 0.

                pointer pNewBegin = DoAllocate(nLength);
                pointer pNewEnd   = pNewBegin;

                pNewEnd = CharStringUninitializedCopy(mpBegin, mpEnd, pNewBegin);
                pNewEnd = CharStringUninitializedCopy(pBegin,  pEnd,  pNewEnd);
               *pNewEnd = 0;

                DeallocateSelf();
                mpBegin    = pNewBegin;
                mpEnd      = pNewEnd;
                mpCapacity = pNewBegin + nLength; 
            }
            else
            {
                const value_type* pTemp = pBegin;
                ++pTemp;
                CharStringUninitializedCopy(pTemp, pEnd, mpEnd + 1);
                mpEnd[n] = 0;
               *mpEnd    = *pBegin;
                mpEnd   += n;
            }
        }

        return *this; 
    }